

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

string_view
google::protobuf::internal::TcParser::FieldName(TcParseTableBase *table,FieldEntry *field_entry)

{
  string_view sVar1;
  
  sVar1 = FindName((char *)((long)&table->has_bits_offset +
                           (ulong)table->num_aux_entries * 8 + (ulong)table->aux_offset),
                   (ulong)table->num_field_entries + 1,
                   (long)((long)field_entry -
                         ((long)&table->has_bits_offset + (ulong)table->field_entries_offset)) / 0xc
                   + 1);
  return sVar1;
}

Assistant:

absl::string_view TcParser::FieldName(const TcParseTableBase* table,
                                      const FieldEntry* field_entry) {
  const FieldEntry* const field_entries = table->field_entries_begin();
  auto field_index = static_cast<size_t>(field_entry - field_entries);
  return FindName(table->name_data(), table->num_field_entries + 1,
                  field_index + 1);
}